

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::BasicReporter::StartTesting(BasicReporter *this)

{
  std::__cxx11::string::_M_assign((string *)&this->m_testingSpan);
  (this->m_testingSpan).emitted = false;
  return;
}

Assistant:

virtual void StartTesting() {
            m_testingSpan = SpanInfo();
        }